

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O1

void __thiscall xLearn::DMATRIX_TEST_Reset_Test::TestBody(DMATRIX_TEST_Reset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  DMatrix matrix;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertHelper local_90;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  DMatrix local_78;
  
  local_78.pos = 0;
  local_78.hash_value_1 = 0;
  local_78.hash_value_2 = 0;
  local_78.row_length = 0;
  local_78.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_78.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_78.row.
  super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = SUB648(ZEXT464(0) << 0x40,7);
  local_78.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.has_label = false;
  DMatrix::Reset(&local_78);
  local_98.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_88,"matrix.has_label","true",&local_78.has_label,(bool *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_ = local_98.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_88,"matrix.hash_value_1","0",&local_78.hash_value_1,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_ = local_98.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_88,"matrix.hash_value_2","0",&local_78.hash_value_2,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_ = local_98.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_88,"matrix.row_length","0",&local_78.row_length,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_ = local_98.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_88,"matrix.pos","0",&local_78.pos,(int *)&local_98);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_._0_1_ =
       local_78.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start ==
       local_78.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_90.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_88,"matrix.Y.empty()","true",(bool *)&local_98,(bool *)&local_90);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_._0_1_ =
       local_78.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_78.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_90.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_88,"matrix.norm.empty()","true",(bool *)&local_98,(bool *)&local_90);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x33,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98.ptr_._0_1_ =
       local_78.row.
       super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (pointer)CONCAT71(local_78.row.
                         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                         local_78.row.
                         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_1_);
  local_90.data_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            (local_88,"matrix.row.empty()","true",(bool *)&local_98,(bool *)&local_90);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  DMatrix::~DMatrix(&local_78);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Reset) {
  DMatrix matrix;
  matrix.Reset();
  EXPECT_EQ(matrix.has_label, true);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, 0);
  EXPECT_EQ(matrix.pos, 0);
  EXPECT_EQ(matrix.Y.empty(), true);
  EXPECT_EQ(matrix.norm.empty(), true);
  EXPECT_EQ(matrix.row.empty(),true);
}